

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::SortHelper<StringItem>(Var array,CompareVarsInfo *cvInfo)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ThreadContext *threadContext;
  Var pvVar4;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  JavascriptLibrary *this;
  RecyclableObject *value;
  JavascriptArray *pJVar8;
  TypeId type;
  BOOL gotItem;
  Var item;
  BOOL hasItem;
  uint32 j;
  uint32 i;
  uint32 holes;
  uint32 undefinedValues;
  uint32 values;
  undefined8 local_c8;
  TrackAllocData local_c0;
  StringItem *local_98;
  StringItem *list;
  ArenaAllocator *tempAlloc;
  TempArenaAllocatorObject *temptempAlloc;
  RecyclableObject *pRStack_78;
  uint32 len;
  RecyclableObject *obj;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext;
  CompareVarsInfo *cvInfo_local;
  Var array_local;
  TypeId local_18;
  TypeId typeId;
  
  jsReentLock._24_8_ = cvInfo->scriptContext;
  threadContext = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
  JsReentLock::JsReentLock((JsReentLock *)local_60,threadContext);
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,array);
  pRStack_78 = (RecyclableObject *)0x0;
  BVar3 = JavascriptConversion::ToObject
                    (array,(ScriptContext *)jsReentLock._24_8_,&stack0xffffffffffffff88);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec42,L"Array.prototype.sort");
  }
  JsReentLock::unlock((JsReentLock *)local_60);
  pvVar4 = Js::JavascriptOperators::OP_GetLength(pRStack_78,(ScriptContext *)jsReentLock._24_8_);
  temptempAlloc._4_4_ = JavascriptConversion::ToUInt32(pvVar4,(ScriptContext *)jsReentLock._24_8_);
  JsReentLock::MutateArrayObject((JsReentLock *)local_60);
  JsReentLock::relock((JsReentLock *)local_60);
  if (temptempAlloc._4_4_ != 0) {
    tempAlloc = (ArenaAllocator *)
                ScriptContext::GetTemporaryAllocator((ScriptContext *)jsReentLock._24_8_,L"Runtime")
    ;
    pAVar5 = &TempArenaAllocatorWrapper<false>::GetAllocator
                        ((TempArenaAllocatorWrapper<false> *)tempAlloc)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    list = (StringItem *)pAVar5;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_c0,(type_info *)&StringItem::typeinfo,0,(ulong)temptempAlloc._4_4_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
               ,0x1b24);
    pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar5,&local_c0);
    _undefinedValues = Memory::ArenaAllocator::Alloc;
    local_c8 = 0;
    local_98 = Memory::AllocateArray<Memory::ArenaAllocator,StringItem,false>
                         ((Memory *)pAVar5,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                          (ulong)temptempAlloc._4_4_);
    holes = 0;
    i = 0;
    j = 0;
    item._4_4_ = 0;
    for (hasItem = 0; (uint)hasItem < temptempAlloc._4_4_; hasItem = hasItem + 1) {
      JsReentLock::unlock((JsReentLock *)local_60);
      item._0_4_ = Js::JavascriptOperators::HasItem(pRStack_78,hasItem);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      JsReentLock::relock((JsReentLock *)local_60);
      if ((BOOL)item == 0) {
        j = j + 1;
      }
      else {
        _type = (Var)0x0;
        JsReentLock::unlock((JsReentLock *)local_60);
        BVar3 = Js::JavascriptOperators::GetItem
                          (pRStack_78,hasItem,(Var *)&type,(ScriptContext *)jsReentLock._24_8_);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        JsReentLock::relock((JsReentLock *)local_60);
        pvVar4 = _type;
        if (BVar3 == 0) {
          j = j + 1;
        }
        else {
          if (_type == (Var)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          bVar2 = TaggedInt::Is(pvVar4);
          if (bVar2) {
            local_18 = TypeIds_FirstNumberType;
          }
          else {
            bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar4);
            if (bVar2) {
              local_18 = TypeIds_Number;
            }
            else {
              pRVar7 = UnsafeVarTo<Js::RecyclableObject>(pvVar4);
              if (pRVar7 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 0;
              }
              local_18 = RecyclableObject::GetTypeId(pRVar7);
              if ((0x57 < (int)local_18) &&
                 (BVar3 = RecyclableObject::IsExternal(pRVar7), BVar3 == 0)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                            "GetTypeId aValue has invalid TypeId");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar6 = 0;
              }
            }
          }
          if (local_18 == TypeIds_Undefined) {
            i = i + 1;
          }
          else {
            SortSetHelper(local_98,_type,holes,(JsReentLock *)local_60,
                          (ScriptContext *)jsReentLock._24_8_);
            holes = holes + 1;
          }
        }
      }
    }
    if (holes < 0x200) {
      JsReentLock::unlock((JsReentLock *)local_60);
      InsertionSort<StringItem>(local_98,holes,cvInfo);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      JsReentLock::relock((JsReentLock *)local_60);
    }
    else {
      JsReentLock::unlock((JsReentLock *)local_60);
      MergeSort<StringItem>(local_98,holes,cvInfo,(ArenaAllocator *)list);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      JsReentLock::relock((JsReentLock *)local_60);
    }
    for (hasItem = 0; (uint)hasItem < holes; hasItem = hasItem + 1) {
      JsReentLock::unlock((JsReentLock *)local_60);
      pRVar7 = pRStack_78;
      BVar3 = hasItem;
      pvVar4 = SortGetHelper(local_98,hasItem);
      Js::JavascriptOperators::SetItem
                (pRVar7,pRVar7,BVar3,pvVar4,(ScriptContext *)jsReentLock._24_8_,
                 PropertyOperation_ThrowIfNonWritable|PropertyOperation_ThrowIfNotExtensible,0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      JsReentLock::relock((JsReentLock *)local_60);
    }
    for (; item._4_4_ < i; item._4_4_ = item._4_4_ + 1) {
      JsReentLock::unlock((JsReentLock *)local_60);
      pRVar7 = pRStack_78;
      BVar3 = hasItem;
      this = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
      value = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      Js::JavascriptOperators::SetItem
                (pRVar7,pRVar7,BVar3,value,(ScriptContext *)jsReentLock._24_8_,
                 PropertyOperation_ThrowIfNonWritable|PropertyOperation_ThrowIfNotExtensible,0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      JsReentLock::relock((JsReentLock *)local_60);
      hasItem = hasItem + 1;
    }
    for (item._4_4_ = 0; item._4_4_ < j; item._4_4_ = item._4_4_ + 1) {
      JsReentLock::unlock((JsReentLock *)local_60);
      Js::JavascriptOperators::DeleteItem
                (pRStack_78,hasItem,PropertyOperation_ThrowOnDeleteIfNotConfig);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      JsReentLock::relock((JsReentLock *)local_60);
      hasItem = hasItem + 1;
    }
    ScriptContext::ReleaseTemporaryAllocator
              ((ScriptContext *)jsReentLock._24_8_,(TempArenaAllocatorObject *)tempAlloc);
    bVar2 = VarIs<Js::JavascriptArray,Js::RecyclableObject>(pRStack_78);
    if (bVar2) {
      pJVar8 = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(pRStack_78);
      ClearSegmentMap(pJVar8);
      pJVar8 = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(pRStack_78);
      (*(pJVar8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
        super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
    }
  }
  pRVar7 = pRStack_78;
  temptempAlloc._0_4_ = 1;
  JsReentLock::~JsReentLock((JsReentLock *)local_60);
  return pRVar7;
}

Assistant:

Var JavascriptArray::SortHelper(Var array, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        ScriptContext* scriptContext = cvInfo->scriptContext;
        
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, array);

        // Per spec, throw if the 'this' value is not a valid object
        RecyclableObject* obj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(array, scriptContext, &obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.sort"));
        }

        // Get the Length
        JS_REENTRANT(jsReentLock,
            uint32 len = JavascriptConversion::ToUInt32(JavascriptOperators::OP_GetLength(obj, scriptContext), scriptContext));

        // Early return if length = 0
        // Note cannot return early for length = 1 without further checks
        // As per spec we must use HasItem() and GetItem() on each element
        if (len == 0)
        {
            return obj;
        }

        BEGIN_TEMP_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"))
        {
            // Spec mandates that we copy the array into a 'list' before sorting
            // This severely limits the potential for sort side-effects to alter the result
            T* list = AnewArray(tempAlloc, T, len);

            uint32 values = 0;
            uint32 undefinedValues = 0;
            uint32 holes = 0;
            uint32 i = 0, j = 0;

            for (; i < len; ++i)
            {
                JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, i));
                
                if (hasItem)
                {
                    Var item = nullptr;
                    JS_REENTRANT(jsReentLock, BOOL gotItem = JavascriptOperators::GetItem(obj, i, &item, scriptContext));
                    if (gotItem)
                    {
                        TypeId type = JavascriptOperators::GetTypeId(item);
                        if (type != TypeIds_Undefined)
                        {
                            // If T = Var this adds item to the list
                            // If T = StringItem this creates a StringItem from the Var and adds that to the list
                            SortSetHelper(list, item, values, &jsReentLock, scriptContext);
                            values++;
                        }
                        else
                        {
                            ++undefinedValues;
                        }
                    }
                    else
                    {
                        ++holes;
                    }
                }
                else
                {
                    ++holes;
                }
            }

            // Call the appropriate Sorting Algorithm
            // Insertion sort uses less memory and is quicker on short arrays but gets less efficient as arrays get longer
            if (values < 512)
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::InsertionSort<T>(list, values, cvInfo));
            }
            else
            {
                JS_REENTRANT(jsReentLock, JavascriptArray::MergeSort<T>(list, values, cvInfo, tempAlloc));
            }

            // Write the sorted data back to the original array
            // Undefined values and holes are placed at the end
            for (i = 0; i < values; ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::SetItem(obj, obj, i, SortGetHelper(list, i), scriptContext, static_cast<PropertyOperationFlags>(PropertyOperation_ThrowIfNonWritable | PropertyOperation_ThrowIfNotExtensible)));
            }
            for (; j < undefinedValues; ++j, ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::SetItem(obj, obj, i, scriptContext->GetLibrary()->GetUndefined(), scriptContext, static_cast<PropertyOperationFlags>(PropertyOperation_ThrowIfNonWritable | PropertyOperation_ThrowIfNotExtensible)));
            }
            for (j = 0; j < holes; ++j, ++i)
            {
                JS_REENTRANT(jsReentLock, JavascriptOperators::DeleteItem(obj, i, PropertyOperation_ThrowOnDeleteIfNotConfig));
            }
        }
        END_TEMP_ALLOCATOR(tempAlloc, scriptContext);

        // if the Array is not just an array-like object but an actual array we clear the Segment map
        // optimised access CC generates for arrays that may have been mangled by sorting
        if (VarIs<JavascriptArray>(obj))
        {
            UnsafeVarTo<JavascriptArray>(obj)->ClearSegmentMap();
            #ifdef VALIDATE_ARRAY
            UnsafeVarTo<JavascriptArray>(obj)->ValidateArray();
            #endif
        }

        return obj;
    }